

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

Fra_Sml_t * Fra_SmlSimulateComb(Aig_Man_t *pAig,int nWords,int fCheckMiter)

{
  int iVar1;
  Fra_Sml_t *p;
  
  p = (Fra_Sml_t *)malloc((long)nWords * 4 * (long)pAig->vObjs->nSize + 0x28);
  memset(p,0,(long)nWords * 4 + 0x28);
  p->pAig = pAig;
  p->nPref = 0;
  p->nFrames = 1;
  p->nWordsFrame = nWords;
  p->nWordsTotal = nWords;
  p->nWordsPref = 0;
  Fra_SmlInitialize(p,0);
  Fra_SmlSimulateOne(p);
  if (fCheckMiter != 0) {
    iVar1 = Fra_SmlCheckNonConstOutputs(p);
    p->fNonConstOut = iVar1;
  }
  return p;
}

Assistant:

Fra_Sml_t * Fra_SmlSimulateComb( Aig_Man_t * pAig, int nWords, int fCheckMiter )
{
    Fra_Sml_t * p;
    p = Fra_SmlStart( pAig, 0, 1, nWords );
    Fra_SmlInitialize( p, 0 );
    Fra_SmlSimulateOne( p );
    if ( fCheckMiter )
        p->fNonConstOut = Fra_SmlCheckNonConstOutputs( p );
    return p;
}